

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O1

void __thiscall
icu_63::SameValueSubstitution::SameValueSubstitution
          (SameValueSubstitution *this,int32_t _pos,NFRuleSet *_ruleSet,UnicodeString *description,
          UErrorCode *status)

{
  short sVar1;
  int8_t iVar2;
  int32_t length;
  
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,description,status);
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SameValueSubstitution_003b61e8;
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (description->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  iVar2 = UnicodeString::doCompare(description,0,length,L"==",0,2);
  if (iVar2 == '\0') {
    *status = U_PARSE_ERROR;
  }
  return;
}

Assistant:

SameValueSubstitution::SameValueSubstitution(int32_t _pos,
                        const NFRuleSet* _ruleSet,
                        const UnicodeString& description,
                        UErrorCode& status)
: NFSubstitution(_pos, _ruleSet, description, status)
{
    if (0 == description.compare(gEqualsEquals, 2)) {
        // throw new IllegalArgumentException("== is not a legal token");
        status = U_PARSE_ERROR;
    }
}